

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatetimeParser.cpp
# Opt level: O2

bool __thiscall DatetimeParser::parse_date_ext(DatetimeParser *this,Pig *pig)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  size_type previous;
  size_type previous_00;
  DatetimeParser *pDVar4;
  int month;
  int year;
  int weekday;
  int week;
  int julian;
  int day;
  
  pDVar4 = (DatetimeParser *)pig;
  previous = Pig::cursor(pig);
  year = 0;
  bVar1 = parse_year(pDVar4,pig,&year);
  if ((bVar1) && (bVar1 = Pig::skip(pig,0x2d), bVar1)) {
    previous_00 = Pig::cursor(pig);
    month = 0;
    day = 0;
    julian = 0;
    week = 0;
    weekday = 0;
    pDVar4 = (DatetimeParser *)pig;
    bVar1 = Pig::skip(pig,0x57);
    if ((bVar1) && (bVar1 = parse_week(pDVar4,pig,&week), bVar1)) {
      pDVar4 = (DatetimeParser *)pig;
      bVar1 = Pig::skip(pig,0x2d);
      if ((!bVar1) || (bVar1 = parse_weekday(pDVar4,pig,&weekday), !bVar1)) {
        weekday = Datetime::weekstart;
      }
      uVar2 = Pig::peek(pig);
      bVar1 = unicodeLatinDigit(uVar2);
      if (!bVar1) {
        this->_weekday = weekday;
        this->_week = week;
        this->_year = year;
        return true;
      }
    }
    pDVar4 = (DatetimeParser *)pig;
    Pig::restoreTo(pig,previous_00);
    bVar1 = parse_month(pDVar4,pig,&month);
    if (((bVar1) && (pDVar4 = (DatetimeParser *)pig, bVar1 = Pig::skip(pig,0x2d), bVar1)) &&
       (bVar1 = parse_day(pDVar4,pig,&day), bVar1)) {
      uVar2 = Pig::peek(pig);
      bVar1 = unicodeLatinDigit(uVar2);
      if (!bVar1) {
        this->_year = year;
        this->_month = month;
        this->_day = day;
        return true;
      }
    }
    pDVar4 = (DatetimeParser *)pig;
    Pig::restoreTo(pig,previous_00);
    bVar1 = parse_julian(pDVar4,pig,&julian);
    if (bVar1) {
      uVar2 = Pig::peek(pig);
      bVar1 = unicodeLatinDigit(uVar2);
      if (!bVar1) {
        this->_year = year;
        this->_julian = julian;
        return true;
      }
    }
    pDVar4 = (DatetimeParser *)pig;
    Pig::restoreTo(pig,previous_00);
    bVar1 = parse_month(pDVar4,pig,&month);
    if ((bVar1) && (iVar3 = Pig::peek(pig), iVar3 != 0x2d)) {
      uVar2 = Pig::peek(pig);
      bVar1 = unicodeLatinDigit(uVar2);
      if (!bVar1) {
        this->_year = year;
        this->_month = month;
        this->_day = 1;
        return true;
      }
    }
  }
  Pig::restoreTo(pig,previous);
  return false;
}

Assistant:

bool DatetimeParser::parse_date_ext (Pig& pig)
{
  auto checkpoint = pig.cursor ();

  int year {};
  if (parse_year (pig, year) &&
      pig.skip ('-'))
  {
    auto checkpointYear = pig.cursor ();

    int month {};
    int day {};
    int julian {};
    int week {};
    int weekday {};

    if (pig.skip ('W') &&
        parse_week (pig, week))
    {
      if (! (pig.skip ('-') &&
             parse_weekday (pig, weekday)))
      {
        weekday = Datetime::weekstart;
      }

      if (! unicodeLatinDigit (pig.peek ()))
      {
        _weekday = weekday;
        _week = week;
        _year = year;
        return true;
      }
    }

    pig.restoreTo (checkpointYear);

    if (parse_month (pig, month) &&
        pig.skip ('-')           &&
        parse_day (pig, day)     &&
        ! unicodeLatinDigit (pig.peek ()))
    {
      _year = year;
      _month = month;
      _day = day;
      return true;
    }

    pig.restoreTo (checkpointYear);

    if (parse_julian (pig, julian) &&
        ! unicodeLatinDigit (pig.peek ()))
    {
      _year = year;
      _julian = julian;
      return true;
    }

    pig.restoreTo (checkpointYear);

    if (parse_month (pig, month) &&
        pig.peek () != '-'       &&
        ! unicodeLatinDigit (pig.peek ()))
    {
      _year = year;
      _month = month;
      _day = 1;
      return true;
    }
  }

  pig.restoreTo (checkpoint);
  return false;
}